

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_print_gnuswitch_ds(arg_dstr_t ds,arg_hdr **table)

{
  bool bVar1;
  char *local_38;
  char *suffix;
  char *format2;
  char *format1;
  int tabindex;
  arg_hdr **table_local;
  arg_dstr_t ds_local;
  
  format2 = " -%c";
  suffix = " [-%c";
  local_38 = "";
  format1._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (table[format1._4_4_] != (arg_hdr *)0x0) {
      bVar1 = (table[format1._4_4_]->flag & 1U) == 0;
    }
    if (!bVar1) break;
    if (((0 < table[format1._4_4_]->mincount) && (table[format1._4_4_]->shortopts != (char *)0x0))
       && ((table[format1._4_4_]->flag & 2U) == 0)) {
      arg_dstr_catf(ds,format2,(ulong)(uint)(int)*table[format1._4_4_]->shortopts);
      format2 = "%c";
      suffix = "[%c";
    }
    format1._4_4_ = format1._4_4_ + 1;
  }
  format1._4_4_ = 0;
  while( true ) {
    bVar1 = false;
    if (table[format1._4_4_] != (arg_hdr *)0x0) {
      bVar1 = (table[format1._4_4_]->flag & 1U) == 0;
    }
    if (!bVar1) break;
    if (((table[format1._4_4_]->mincount < 1) && (table[format1._4_4_]->shortopts != (char *)0x0))
       && ((table[format1._4_4_]->flag & 2U) == 0)) {
      arg_dstr_catf(ds,suffix,(ulong)(uint)(int)*table[format1._4_4_]->shortopts);
      suffix = "%c";
      local_38 = "]";
    }
    format1._4_4_ = format1._4_4_ + 1;
  }
  arg_dstr_catf(ds,"%s",local_38);
  return;
}

Assistant:

static void arg_print_gnuswitch_ds(arg_dstr_t ds, struct arg_hdr** table) {
    int tabindex;
    char* format1 = " -%c";
    char* format2 = " [-%c";
    char* suffix = "";

    /* print all mandatory switches that are without argument values */
    for (tabindex = 0; table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        /* skip optional options */
        if (table[tabindex]->mincount < 1)
            continue;

        /* skip non-short options */
        if (table[tabindex]->shortopts == NULL)
            continue;

        /* skip options that take argument values */
        if (table[tabindex]->flag & ARG_HASVALUE)
            continue;

        /* print the short option (only the first short option char, ignore multiple choices)*/
        arg_dstr_catf(ds, format1, table[tabindex]->shortopts[0]);
        format1 = "%c";
        format2 = "[%c";
    }

    /* print all optional switches that are without argument values */
    for (tabindex = 0; table[tabindex] && !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        /* skip mandatory args */
        if (table[tabindex]->mincount > 0)
            continue;

        /* skip args without short options */
        if (table[tabindex]->shortopts == NULL)
            continue;

        /* skip args with values */
        if (table[tabindex]->flag & ARG_HASVALUE)
            continue;

        /* print first short option */
        arg_dstr_catf(ds, format2, table[tabindex]->shortopts[0]);
        format2 = "%c";
        suffix = "]";
    }

    arg_dstr_catf(ds, "%s", suffix);
}